

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O3

__pid_t __thiscall
kj::Promise<kj::Array<unsigned_char>_>::wait
          (Promise<kj::Array<unsigned_char>_> *this,void *__stat_loc)

{
  anon_union_344_1_a8c68091_for_NullableValue<kj::Exception>_2 *exception;
  WaitScope *in_RDX;
  ExceptionOrValue local_190;
  char local_30;
  Disposer *local_28;
  PromiseNode *pPStack_20;
  Disposer *local_18;
  
  local_190.exception.ptr.isSet = false;
  local_30 = '\0';
  _::waitImpl((Own<kj::_::PromiseNode> *)__stat_loc,&local_190,in_RDX);
  if (local_30 == '\x01') {
    exception = &local_190.exception.ptr.field_1;
    if (local_190.exception.ptr.isSet != false) {
      throwRecoverableException(&exception->value,0);
    }
    (this->super_PromiseBase).node.disposer = local_28;
    (this->super_PromiseBase).node.ptr = pPStack_20;
    this[1].super_PromiseBase.node.disposer = local_18;
    local_28 = (Disposer *)0x0;
    pPStack_20 = (PromiseNode *)0x0;
    if (local_190.exception.ptr.isSet == true) {
      Exception::~Exception(&exception->value);
    }
    return (__pid_t)this;
  }
  if (local_190.exception.ptr.isSet == false) {
    _::unreachable();
  }
  throwFatalException(&local_190.exception.ptr.field_1.value,0);
}

Assistant:

T Promise<T>::wait(WaitScope& waitScope) {
  _::ExceptionOr<_::FixVoid<T>> result;

  _::waitImpl(kj::mv(node), result, waitScope);

  KJ_IF_MAYBE(value, result.value) {
    KJ_IF_MAYBE(exception, result.exception) {
      throwRecoverableException(kj::mv(*exception));
    }
    return _::returnMaybeVoid(kj::mv(*value));
  } else KJ_IF_MAYBE(exception, result.exception) {
    throwFatalException(kj::mv(*exception));
  } else {
    // Result contained neither a value nor an exception?
    KJ_UNREACHABLE;
  }